

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

ssize_t __thiscall
icu_63::StringTrieBuilder::ListBranchNode::write
          (ListBranchNode *this,int __fd,void *__buf,size_t __n)

{
  Node *this_00;
  int iVar1;
  int32_t iVar2;
  undefined4 in_register_00000034;
  StringTrieBuilder *builder;
  int32_t local_44;
  bool local_31;
  uint local_30;
  UBool isFinal;
  int32_t value;
  int32_t rightEdgeNumber;
  Node *rightEdge;
  int32_t unitNumber;
  StringTrieBuilder *builder_local;
  ListBranchNode *this_local;
  
  builder = (StringTrieBuilder *)CONCAT44(in_register_00000034,__fd);
  rightEdge._4_4_ = this->length + -1;
  this_00 = this->equal[(int)rightEdge._4_4_];
  if (this_00 == (Node *)0x0) {
    local_44 = (this->super_BranchNode).firstEdgeNumber;
  }
  else {
    local_44 = Node::getOffset(this_00);
  }
  do {
    rightEdge._4_4_ = rightEdge._4_4_ + -1;
    if (this->equal[(int)rightEdge._4_4_] != (Node *)0x0) {
      Node::writeUnlessInsideRightEdge
                (this->equal[(int)rightEdge._4_4_],(this->super_BranchNode).firstEdgeNumber,local_44
                 ,builder);
    }
  } while (0 < (int)rightEdge._4_4_);
  rightEdge._4_4_ = this->length - 1;
  if (this_00 == (Node *)0x0) {
    (*(builder->super_UObject)._vptr_UObject[0x11])
              (builder,(ulong)(uint)this->values[(int)rightEdge._4_4_],1);
  }
  else {
    (*(this_00->super_UObject)._vptr_UObject[5])(this_00,builder);
  }
  iVar1 = (*(builder->super_UObject)._vptr_UObject[0xf])
                    (builder,(ulong)(ushort)this->units[(int)rightEdge._4_4_]);
  (this->super_BranchNode).super_Node.offset = iVar1;
  while( true ) {
    rightEdge._4_4_ = rightEdge._4_4_ - 1;
    if ((int)rightEdge._4_4_ < 0) break;
    local_31 = this->equal[(int)rightEdge._4_4_] != (Node *)0x0;
    if (local_31) {
      iVar1 = (this->super_BranchNode).super_Node.offset;
      iVar2 = Node::getOffset(this->equal[(int)rightEdge._4_4_]);
      local_30 = iVar1 - iVar2;
    }
    else {
      local_30 = this->values[(int)rightEdge._4_4_];
    }
    local_31 = !local_31;
    (*(builder->super_UObject)._vptr_UObject[0x11])
              (builder,(ulong)local_30,(ulong)(uint)(int)local_31);
    iVar1 = (*(builder->super_UObject)._vptr_UObject[0xf])
                      (builder,(ulong)(ushort)this->units[(int)rightEdge._4_4_]);
    (this->super_BranchNode).super_Node.offset = iVar1;
  }
  return (ulong)rightEdge._4_4_;
}

Assistant:

void
StringTrieBuilder::ListBranchNode::write(StringTrieBuilder &builder) {
    // Write the sub-nodes in reverse order: The jump lengths are deltas from
    // after their own positions, so if we wrote the minUnit sub-node first,
    // then its jump delta would be larger.
    // Instead we write the minUnit sub-node last, for a shorter delta.
    int32_t unitNumber=length-1;
    Node *rightEdge=equal[unitNumber];
    int32_t rightEdgeNumber= rightEdge==NULL ? firstEdgeNumber : rightEdge->getOffset();
    do {
        --unitNumber;
        if(equal[unitNumber]!=NULL) {
            equal[unitNumber]->writeUnlessInsideRightEdge(firstEdgeNumber, rightEdgeNumber, builder);
        }
    } while(unitNumber>0);
    // The maxUnit sub-node is written as the very last one because we do
    // not jump for it at all.
    unitNumber=length-1;
    if(rightEdge==NULL) {
        builder.writeValueAndFinal(values[unitNumber], TRUE);
    } else {
        rightEdge->write(builder);
    }
    offset=builder.write(units[unitNumber]);
    // Write the rest of this node's unit-value pairs.
    while(--unitNumber>=0) {
        int32_t value;
        UBool isFinal;
        if(equal[unitNumber]==NULL) {
            // Write the final value for the one string ending with this unit.
            value=values[unitNumber];
            isFinal=TRUE;
        } else {
            // Write the delta to the start position of the sub-node.
            U_ASSERT(equal[unitNumber]->getOffset()>0);
            value=offset-equal[unitNumber]->getOffset();
            isFinal=FALSE;
        }
        builder.writeValueAndFinal(value, isFinal);
        offset=builder.write(units[unitNumber]);
    }
}